

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.h
# Opt level: O2

void google::protobuf::internal::ResetOneofField<(google::protobuf::internal::ProcessingType)4>
               (ParseTable *table,int field_number,Arena *arena,MessageLite *msg,uint32 *oneof_case,
               int64 offset,void *default_ptr)

{
  uint uVar1;
  long *plVar2;
  undefined8 uVar3;
  
  uVar1 = *oneof_case;
  if (uVar1 != field_number) {
    if ((ulong)uVar1 != 0) {
      ClearOneofField(table->fields + uVar1,arena,msg);
    }
    *oneof_case = field_number;
    plVar2 = (long *)table->aux[field_number].strings.default_ptr;
    uVar3 = (**(code **)(*plVar2 + 0x20))(plVar2,arena);
    *(undefined8 *)((long)&msg->_vptr_MessageLite + offset) = uVar3;
  }
  return;
}

Assistant:

inline void ResetOneofField(const ParseTable& table, int field_number,
                            Arena* arena, MessageLite* msg, uint32* oneof_case,
                            int64 offset, const void* default_ptr) {
  if (*oneof_case == field_number) {
    // The oneof is already set to the right type, so there is no need to clear
    // it.
    return;
  }

  if (*oneof_case != 0) {
    ClearOneofField(table.fields[*oneof_case], arena, msg);
  }
  *oneof_case = field_number;

  switch (field_type) {
    case ProcessingType_STRING:
      Raw<ArenaStringPtr>(msg, offset)
          ->UnsafeSetDefault(static_cast<const std::string*>(default_ptr));
      break;
    case ProcessingType_INLINED:
      new (Raw<InlinedStringField>(msg, offset))
          InlinedStringField(*static_cast<const std::string*>(default_ptr));
      break;
    case ProcessingType_MESSAGE:
      MessageLite** submessage = Raw<MessageLite*>(msg, offset);
      const MessageLite* prototype =
          table.aux[field_number].messages.default_message();
      *submessage = prototype->New(arena);
      break;
  }
}